

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int fts3MsrBufferData(Fts3MultiSegReader *pMsr,char *pList,int nList)

{
  char *__dest;
  
  if (pMsr->nBuffer < nList) {
    pMsr->nBuffer = nList * 2;
    __dest = (char *)sqlite3_realloc(pMsr->aBuffer,nList * 2);
    if (__dest == (char *)0x0) {
      return 7;
    }
    pMsr->aBuffer = __dest;
  }
  else {
    __dest = pMsr->aBuffer;
  }
  memcpy(__dest,pList,(long)nList);
  return 0;
}

Assistant:

static int fts3MsrBufferData(
  Fts3MultiSegReader *pMsr,       /* Multi-segment-reader handle */
  char *pList,
  int nList
){
  if( nList>pMsr->nBuffer ){
    char *pNew;
    pMsr->nBuffer = nList*2;
    pNew = (char *)sqlite3_realloc(pMsr->aBuffer, pMsr->nBuffer);
    if( !pNew ) return SQLITE_NOMEM;
    pMsr->aBuffer = pNew;
  }

  memcpy(pMsr->aBuffer, pList, nList);
  return SQLITE_OK;
}